

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

value_type __thiscall
FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>_>
::dx(FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Fad<double> *pFVar4;
  FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_> *pFVar5;
  Fad<double> *pFVar6;
  double *pdVar7;
  double *pdVar8;
  double dVar9;
  double dVar10;
  
  pFVar4 = (this->fadexpr_).expr_.fadexpr_.left_;
  pdVar8 = &pFVar4->defaultVal;
  if ((pFVar4->dx_).num_elts != 0) {
    pdVar8 = (pFVar4->dx_).ptr_to_data + i;
  }
  pFVar5 = (this->fadexpr_).expr_.fadexpr_.right_;
  pFVar6 = (pFVar5->fadexpr_).left_;
  pdVar7 = &pFVar6->defaultVal;
  if ((pFVar6->dx_).num_elts != 0) {
    pdVar7 = (pFVar6->dx_).ptr_to_data + i;
  }
  dVar9 = pFVar6->val_ - (double)(pFVar5->fadexpr_).right_.constant_;
  dVar1 = pFVar4->val_;
  dVar2 = *pdVar7;
  dVar3 = *pdVar8;
  dVar10 = sinh(dVar9 * dVar1);
  return dVar10 * (dVar3 * dVar9 + dVar2 * dVar1);
}

Assistant:

value_type dx(int i) const { return fadexpr_.dx(i);}